

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLOptions.h
# Opt level: O1

CLInt * __thiscall CLInt::operator=(CLInt *this,string *other)

{
  stringstream sstream;
  stringstream asStack_198 [16];
  ostream local_188 [112];
  ios_base local_118 [264];
  
  std::__cxx11::stringstream::stringstream(asStack_198);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_188,(other->_M_dataplus)._M_p,other->_M_string_length);
  std::istream::operator>>((istream *)asStack_198,&(this->super_CLParam<int>).value);
  (this->super_CLParam<int>).is_set = true;
  std::__cxx11::stringstream::~stringstream(asStack_198);
  std::ios_base::~ios_base(local_118);
  return this;
}

Assistant:

CLInt& operator=(const std::string& other) {
        std::stringstream sstream ;
        sstream << other ;
        sstream >> value ;
        is_set = true ;
        return *this ;
    }